

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::addSource
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr file)

{
  RemoveConst<capnp::compiler::CompilerMain::SourceFile> **ppRVar1;
  Disposer *pDVar2;
  Compiler *pCVar3;
  RemoveConst<capnp::compiler::CompilerMain::SourceFile> *pRVar4;
  Module *module_00;
  PathPtr path;
  String *pSVar5;
  int iVar6;
  undefined4 extraout_var;
  RemoveConst<capnp::compiler::CompilerMain::SourceFile> *pRVar7;
  size_t extraout_RDX;
  long lVar8;
  size_t sVar9;
  Module *module;
  StringPtr pathStr;
  StringPtr pathStr_00;
  ModuleScope compiled;
  DirPathPair dirPathPair;
  ModuleScope local_90;
  size_t local_78;
  Validity *local_70;
  GlobalErrorReporter local_68;
  String *local_60;
  Disposer *pDStack_58;
  ArrayDisposer *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  pathStr.content.ptr = file.content.ptr;
  if (this->compilerConstructed == false) {
    Compiler::Compiler((Compiler *)&this->compilerSpace,this->annotationFlag);
    pDVar2 = (this->compiler).disposer;
    pCVar3 = (this->compiler).ptr;
    (this->compiler).disposer =
         (Disposer *)&kj::DestructorOnlyDisposer<capnp::compiler::Compiler>::instance;
    (this->compiler).ptr = (Compiler *)&this->compilerSpace;
    if (pCVar3 != (Compiler *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pCVar3->super_LazyLoadCallback)._vptr_LazyLoadCallback[-2] +
                        (long)&(pCVar3->super_LazyLoadCallback)._vptr_LazyLoadCallback);
    }
    this->compilerConstructed = true;
  }
  sVar9 = file.content.size_;
  if (this->addStandardImportPaths == true) {
    lVar8 = 8;
    local_78 = file.content.size_;
    local_70 = __return_storage_ptr__;
    do {
      pathStr_00.content.size_ = *(size_t *)((long)&PTR_typeinfo_0027a468 + lVar8);
      pathStr_00.content.ptr = (char *)this;
      getSourceDirectory((CompilerMain *)&stack0xffffffffffffff98,pathStr_00,
                         SUB81(*(undefined8 *)
                                ((long)&addSource::STANDARD_IMPORT_PATHS[0].content.ptr + lVar8),0))
      ;
      if ((String *)local_68._vptr_GlobalErrorReporter != (String *)0x0) {
        ModuleLoader::addImportPath
                  (&this->loader,(ReadableDirectory *)local_68._vptr_GlobalErrorReporter);
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x38);
    this->addStandardImportPaths = false;
    __return_storage_ptr__ = local_70;
    sVar9 = local_78;
  }
  pathStr.content.size_ = sVar9;
  interpretSourceFile((DirPathPair *)&stack0xffffffffffffff98,this,pathStr);
  path.parts.size_ = (size_t)local_60;
  path.parts.ptr = (String *)local_68._vptr_GlobalErrorReporter;
  ModuleLoader::loadModule((ModuleLoader *)&local_90,(ReadableDirectory *)&this->loader,path);
  module_00 = (Module *)CONCAT44(local_90.compiler._4_4_,local_90.compiler._0_4_);
  if (module_00 == (Module *)0x0) {
    kj::heapString((String *)&local_90,"no such file",0xc);
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
         (char *)CONCAT44(local_90.compiler._4_4_,local_90.compiler._0_4_);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
         CONCAT44(local_90.id._4_4_,(undefined4)local_90.id);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         (ArrayDisposer *)local_90.node;
  }
  else {
    Compiler::add(&local_90,(this->compiler).ptr,module_00);
    Compiler::eagerlyCompile
              ((this->compiler).ptr,CONCAT44(local_90.id._4_4_,(undefined4)local_90.id),
               this->compileEagerness);
    local_48 = local_90.compiler._0_4_;
    uStack_44 = local_90.compiler._4_4_;
    uStack_40 = (undefined4)local_90.id;
    uStack_3c = local_90.id._4_4_;
    local_38 = local_90.node;
    iVar6 = (*(module_00->super_ErrorReporter)._vptr_ErrorReporter[3])(module_00);
    pRVar7 = (this->sourceFiles).builder.pos;
    if (pRVar7 == (this->sourceFiles).builder.endPtr) {
      pRVar4 = (this->sourceFiles).builder.ptr;
      sVar9 = 4;
      if (pRVar7 != pRVar4) {
        sVar9 = ((long)pRVar7 - (long)pRVar4 >> 3) * -0x2492492492492492;
      }
      kj::Vector<capnp::compiler::CompilerMain::SourceFile>::setCapacity(&this->sourceFiles,sVar9);
      pRVar7 = (this->sourceFiles).builder.pos;
    }
    pRVar7->id = CONCAT44(local_90.id._4_4_,(undefined4)local_90.id);
    (pRVar7->compiled).compiler = (Compiler *)CONCAT44(uStack_44,local_48);
    (pRVar7->compiled).id = CONCAT44(uStack_3c,uStack_40);
    (pRVar7->compiled).node = (Node *)local_38;
    (pRVar7->name).content.ptr = (char *)CONCAT44(extraout_var,iVar6);
    (pRVar7->name).content.size_ = extraout_RDX;
    pRVar7->module = module_00;
    ppRVar1 = &(this->sourceFiles).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  }
  pDVar2 = pDStack_58;
  pSVar5 = local_60;
  if (local_60 != (String *)0x0) {
    local_60 = (String *)0x0;
    pDStack_58 = (Disposer *)0x0;
    (**local_50->_vptr_ArrayDisposer)
              (local_50,pSVar5,0x18,pDVar2,pDVar2,kj::ArrayDisposer::Dispose_<kj::String>::destruct)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addSource(kj::StringPtr file) {
    if (!compilerConstructed) {
      compiler = compilerSpace.construct(annotationFlag);
      compilerConstructed = true;
    }

    if (addStandardImportPaths) {
      static constexpr kj::StringPtr STANDARD_IMPORT_PATHS[] = {
        "/usr/local/include"_kj,
        "/usr/include"_kj,
#ifdef CAPNP_INCLUDE_DIR
        KJ_CONCAT(CAPNP_INCLUDE_DIR, _kj),
#endif
      };
      for (auto path: STANDARD_IMPORT_PATHS) {
        KJ_IF_SOME(dir, getSourceDirectory(path, false)) {
          loader.addImportPath(dir);
        } else {
          // ignore standard path that doesn't exist
        }
      }

      addStandardImportPaths = false;
    }

    auto dirPathPair = interpretSourceFile(file);
    KJ_IF_SOME(module, loader.loadModule(dirPathPair.dir, dirPathPair.path)) {
      auto compiled = compiler->add(module);
      compiler->eagerlyCompile(compiled.getId(), compileEagerness);
      sourceFiles.add(SourceFile { compiled.getId(), compiled, module.getSourceName(), &module });
    } else {
      return "no such file";
    }